

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

double __thiscall chrono::ChSolverADMM::_SolveFast(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  _func_int **pp_Var5;
  ChSparseMatrix *pCVar6;
  size_t sVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChConstraint *pCVar12;
  element_type *peVar13;
  double *pdVar14;
  ChVectorDynamic<> *pCVar15;
  double *pdVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  Scalar *pSVar25;
  SparseMatrix<double,_1,_int> *pSVar26;
  Index IVar27;
  Index IVar28;
  Index IVar29;
  SparseMatrix<double,_1,_int> *pSVar30;
  ChVectorDynamic<> *pCVar31;
  ChVectorDynamic<> *pCVar32;
  StorageIndex *pSVar33;
  StorageIndex *pSVar34;
  StorageIndex *pSVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  _func_int *p_Var40;
  _func_int *p_Var41;
  _func_int *p_Var42;
  _func_int *p_Var43;
  _func_int *p_Var44;
  _func_int *p_Var45;
  _func_int *p_Var46;
  _func_int **pp_Var47;
  undefined8 uVar48;
  uint uVar49;
  uint uVar50;
  AdmmStepType AVar51;
  undefined4 extraout_var;
  Scalar *pSVar52;
  ChLog *pCVar53;
  ChStreamOutAscii *pCVar54;
  uint uVar55;
  Index index;
  ulong uVar56;
  ulong uVar57;
  char *pcVar58;
  Index index_3;
  long lVar59;
  pointer ppCVar60;
  Index IVar61;
  int iVar62;
  SparseMatrix<double,_1,_int> *pSVar63;
  ulong uVar64;
  Index index_12;
  Index size;
  long lVar65;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  ulong uVar66;
  pointer ppCVar67;
  Index size_1;
  pointer ppCVar68;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  Scalar SVar73;
  Scalar SVar75;
  undefined1 auVar76 [16];
  Scalar SVar74;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar88 [64];
  undefined1 auVar80 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar84 [16];
  undefined1 auVar91 [64];
  undefined1 auVar85 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  double dVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  double dVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  double local_450;
  ChVectorDynamic<> l;
  undefined1 local_419;
  ChVectorDynamic<> z;
  ChVectorDynamic<> vrho;
  ChVectorDynamic<> y;
  ChVectorDynamic<> l_old;
  Index innerSize_1;
  ChVectorDynamic<> S;
  Scalar *local_3b8;
  Index innerSize;
  double local_3a0;
  ChVectorDynamic<> v;
  ChVectorDynamic<> y_old;
  SparseMatrix<double,_1,_int> *local_378;
  long local_370;
  StorageIndex *local_368;
  SparseMatrix<double,_1,_int> *local_360;
  Scalar *local_358;
  undefined1 local_350 [8];
  variable_if_dynamic<long,__1> local_348;
  variable_if_dynamic<long,__1> local_340;
  SparseMatrix<double,_1,_int> *pSStack_338;
  variable_if_dynamic<long,__1> vStack_330;
  variable_if_dynamic<long,__1> vStack_328;
  CompressedStorage<double,_int> CStack_320;
  double local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ChVectorDynamic<> IS;
  SrcEvaluatorType srcEvaluator;
  undefined1 local_2b8 [16];
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_2a8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_2a0;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_298;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_290;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_288;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_280;
  ChVectorDynamic<> v_old;
  ChVectorDynamic<> b;
  double local_258;
  ChVectorDynamic<> B;
  ChVectorDynamic<> vsigma;
  ChVectorDynamic<> z_old;
  ChVectorDynamic<> k;
  double local_1f8;
  SparseMatrix<double,_1,_int> local_1e8;
  Index alignedEnd_1;
  Index alignedEnd;
  long local_188;
  long local_180;
  ChSparseMatrix Cq;
  DstEvaluatorType dstEvaluator;
  ChSparsityPatternLearner sparsity_pattern;
  ChSparseMatrix E;
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  
  local_1f8 = this->rho;
  uVar49 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  uVar50 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  local_2f0 = CONCAT44(extraout_var,uVar50);
  pSVar63 = (SparseMatrix<double,_1,_int> *)(long)(int)uVar50;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)pSVar63);
  if (uVar49 == 0) {
    local_348.m_value = local_348.m_value & 0xffffffffffffff00;
    local_350 = (undefined1  [8])&PTR_SetElement_00b0c488;
    local_340.m_value = 0;
    pSStack_338 = (SparseMatrix<double,_1,_int> *)0x0;
    vStack_330.m_value = 0;
    vStack_328.m_value = 0;
    CStack_320.m_values = (Scalar *)0x0;
    CStack_320.m_indices = (StorageIndex *)0x0;
    CStack_320.m_size = 0;
    CStack_320.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize
              ((SparseMatrix<double,_1,_int> *)local_350,(Index)pSVar63,(Index)pSVar63);
    Cq._vptr_SparseMatrix = (_func_int **)0x0;
    Cq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
    Cq._9_7_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Cq,(Index)pSVar63);
    lVar65 = std::chrono::_V2::system_clock::now();
    ChSparsityPatternLearner::ChSparsityPatternLearner
              (&sparsity_pattern,(int)local_2f0,(int)local_2f0);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,(ChSparseMatrix *)local_350);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,local_350,&Cq);
    peVar13 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_348.m_value._0_1_ == true) {
      pSVar63 = (SparseMatrix<double,_1,_int> *)(peVar13->m_mat).m_outerSize;
      pSVar26 = (SparseMatrix<double,_1,_int> *)(peVar13->m_mat).m_innerSize;
      (peVar13->m_mat).m_outerSize = local_340.m_value;
      (peVar13->m_mat).m_innerSize = (Index)pSStack_338;
      pSVar30 = (SparseMatrix<double,_1,_int> *)(peVar13->m_mat).m_outerIndex;
      pCVar31 = (ChVectorDynamic<> *)(peVar13->m_mat).m_innerNonZeros;
      pCVar32 = (ChVectorDynamic<> *)(peVar13->m_mat).m_data.m_values;
      pSVar33 = (peVar13->m_mat).m_data.m_indices;
      (peVar13->m_mat).m_outerIndex = (StorageIndex *)vStack_330.m_value;
      (peVar13->m_mat).m_innerNonZeros = (StorageIndex *)vStack_328.m_value;
      (peVar13->m_mat).m_data.m_values = CStack_320.m_values;
      (peVar13->m_mat).m_data.m_indices = CStack_320.m_indices;
      pCVar15 = (ChVectorDynamic<> *)(peVar13->m_mat).m_data.m_size;
      IVar61 = (peVar13->m_mat).m_data.m_allocatedSize;
      (peVar13->m_mat).m_data.m_size = CStack_320.m_size;
      (peVar13->m_mat).m_data.m_allocatedSize = CStack_320.m_allocatedSize;
      local_340.m_value = (long)pSVar63;
      pSStack_338 = pSVar26;
      vStack_330.m_value = (long)pSVar30;
      vStack_328.m_value = (long)pCVar31;
      CStack_320.m_values = (Scalar *)pCVar32;
      CStack_320.m_indices = pSVar33;
      CStack_320.m_size = (Index)pCVar15;
      CStack_320.m_allocatedSize = IVar61;
    }
    else {
      pCVar6 = &peVar13->m_mat;
      if (pCVar6 != (ChSparseMatrix *)local_350) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,(SparseMatrix<double,_1,_int> *)local_350);
        if ((ChVectorDynamic<> *)vStack_328.m_value == (ChVectorDynamic<> *)0x0) {
          sVar7 = (peVar13->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar13->m_mat).m_outerIndex,(void *)vStack_330.m_value,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar13->m_mat).m_data,&CStack_320);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,(SparseMatrix<double,_1,_int> *)local_350);
        }
      }
    }
    uVar48 = Cq._8_8_;
    pp_Var47 = Cq._vptr_SparseMatrix;
    peVar13 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != Cq._8_8_) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   Cq._8_8_,1),
       (peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows != uVar48)) goto LAB_007c6ea6;
    pdVar16 = (peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar66 = uVar48 + 7;
    if (-1 < (long)uVar48) {
      uVar66 = uVar48;
    }
    uVar66 = uVar66 & 0xfffffffffffffff8;
    if (7 < (long)uVar48) {
      lVar59 = 0;
      do {
        pp_Var5 = pp_Var47 + lVar59;
        p_Var40 = pp_Var5[1];
        p_Var41 = pp_Var5[2];
        p_Var42 = pp_Var5[3];
        p_Var43 = pp_Var5[4];
        p_Var44 = pp_Var5[5];
        p_Var45 = pp_Var5[6];
        p_Var46 = pp_Var5[7];
        pdVar14 = pdVar16 + lVar59;
        *pdVar14 = (double)*pp_Var5;
        pdVar14[1] = (double)p_Var40;
        pdVar14[2] = (double)p_Var41;
        pdVar14[3] = (double)p_Var42;
        pdVar14[4] = (double)p_Var43;
        pdVar14[5] = (double)p_Var44;
        pdVar14[6] = (double)p_Var45;
        pdVar14[7] = (double)p_Var46;
        lVar59 = lVar59 + 8;
      } while (lVar59 < (long)uVar66);
    }
    if ((long)uVar66 < (long)uVar48) {
      do {
        pdVar16[uVar66] = (double)pp_Var47[uVar66];
        uVar66 = uVar66 + 1;
      } while (uVar48 != uVar66);
    }
    std::chrono::_V2::system_clock::now();
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar53 = GetLog();
      pCVar54 = ChStreamOutAscii::operator<<
                          (&pCVar53->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      lVar59 = std::chrono::_V2::system_clock::now();
      pCVar54 = ChStreamOutAscii::operator<<(pCVar54,(double)(lVar59 - lVar65) / 1000000000.0);
      ChStreamOutAscii::operator<<(pCVar54,"s\n");
    }
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
    (*sysd->_vptr_ChSystemDescriptor[0x11])
              (sysd,&((this->LS_solver).
                      super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_sol);
    ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
    if (Cq._vptr_SparseMatrix != (_func_int **)0x0) {
      free(Cq._vptr_SparseMatrix[-1]);
    }
    local_350 = (undefined1  [8])&PTR_SetElement_00b0c488;
    free((void *)vStack_330.m_value);
    free((void *)vStack_328.m_value);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&CStack_320);
    local_450 = 0.0;
    goto LAB_007c6c3e;
  }
  uVar66 = (ulong)(int)uVar49;
  Cq._8_8_ = Cq._8_8_ & 0xffffffffffffff00;
  Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  Cq.m_outerSize = 0;
  Cq.m_innerSize = 0;
  Cq.m_outerIndex = (StorageIndex *)0x0;
  Cq.m_innerNonZeros = (StorageIndex *)0x0;
  Cq.m_data.m_values = (Scalar *)0x0;
  Cq.m_data.m_indices = (StorageIndex *)0x0;
  Cq.m_data.m_size = 0;
  Cq.m_data.m_allocatedSize = 0;
  local_2e8 = (ulong)uVar49;
  Eigen::SparseMatrix<double,_1,_int>::resize(&Cq,uVar66,(Index)pSVar63);
  E.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  E.m_outerSize = 0;
  E.m_innerSize = 0;
  E.m_outerIndex = (StorageIndex *)0x0;
  E.m_innerNonZeros = (StorageIndex *)0x0;
  E.m_data.m_values = (Scalar *)0x0;
  E.m_data.m_indices = (StorageIndex *)0x0;
  E.m_data.m_size = 0;
  E.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&E,uVar66,uVar66);
  k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)pSVar63);
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  local_1e8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  iVar62 = (int)local_2f0 + (int)local_2e8;
  lVar65 = (long)iVar62;
  local_1e8._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  local_1e8.m_outerSize = 0;
  local_1e8.m_innerSize = 0;
  local_1e8.m_outerIndex = (StorageIndex *)0x0;
  local_1e8.m_innerNonZeros = (StorageIndex *)0x0;
  local_1e8.m_data.m_values = (Scalar *)0x0;
  local_1e8.m_data.m_indices = (StorageIndex *)0x0;
  local_1e8.m_data.m_size = 0;
  local_1e8.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&local_1e8,lVar65,lVar65);
  B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar65);
  l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  local_2e0 = CONCAT44(local_2e0._4_4_,iVar62);
  v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)pSVar63);
  (*sysd->_vptr_ChSystemDescriptor[0x1b])(sysd,&Cq,0);
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&Cq);
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&E);
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
  }
  else {
    (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&l,0);
    (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&v,0);
    if ((Cq.m_innerSize !=
         v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) ||
       (E.m_innerSize !=
        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
      pcVar58 = 
      "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
      goto LAB_007c6de0;
    }
    if (Cq.m_outerSize != E.m_outerSize) {
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>]"
      ;
      goto LAB_007c6fa2;
    }
    if (Cq.m_outerSize !=
        b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007c6fa2;
    }
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize = (Index)&Cq;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerSize = (Index)&v;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerIndex = (StorageIndex *)&E;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerNonZeros = (StorageIndex *)&l;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_data.m_indices = (StorageIndex *)&b;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<double,double>>
              (&y,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&sparsity_pattern,(assign_op<double,_double> *)local_350);
    IVar61 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar16 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if ((z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
         l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ,1),
       z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != IVar61))
    goto LAB_007c6ea6;
    uVar56 = IVar61 + 7;
    if (-1 < IVar61) {
      uVar56 = IVar61;
    }
    uVar56 = uVar56 & 0xfffffffffffffff8;
    if (7 < IVar61) {
      lVar59 = 0;
      do {
        pdVar14 = pdVar16 + lVar59;
        dVar95 = pdVar14[1];
        dVar100 = pdVar14[2];
        dVar8 = pdVar14[3];
        dVar36 = pdVar14[4];
        dVar37 = pdVar14[5];
        dVar38 = pdVar14[6];
        dVar39 = pdVar14[7];
        pdVar1 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 lVar59;
        *pdVar1 = *pdVar14;
        pdVar1[1] = dVar95;
        pdVar1[2] = dVar100;
        pdVar1[3] = dVar8;
        pdVar1[4] = dVar36;
        pdVar1[5] = dVar37;
        pdVar1[6] = dVar38;
        pdVar1[7] = dVar39;
        lVar59 = lVar59 + 8;
      } while (lVar59 < (long)uVar56);
    }
    if ((long)uVar56 < IVar61) {
      do {
        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar56] =
             pdVar16[uVar56];
        uVar56 = uVar56 + 1;
      } while (IVar61 != uVar56);
    }
  }
  S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
  if (this->precond == true) {
    ppCVar67 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar68 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar68 == ppCVar67) {
      uVar56 = 0;
    }
    else {
      uVar57 = 0;
      uVar64 = 1;
      do {
        (*ppCVar67[uVar57]->_vptr_ChConstraint[6])();
        ppCVar67 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar68 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar56 = (long)ppCVar68 - (long)ppCVar67 >> 3;
        bVar17 = uVar64 < uVar56;
        uVar57 = uVar64;
        uVar64 = (ulong)((int)uVar64 + 1);
      } while (bVar17);
    }
    if (uVar56 != 0) {
      uVar55 = 1;
      iVar62 = 0;
      ppCVar60 = ppCVar67;
      do {
        pCVar12 = *ppCVar60;
        if (pCVar12->mode == CONSTRAINT_FRIC) {
          (&sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix)[iVar62] =
               (_func_int **)pCVar12->g_i;
          iVar62 = iVar62 + 1;
          if (iVar62 == 3) {
            dVar95 = ((double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix
                      + (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._8_8_ +
                     (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize) / 3.0;
            ppCVar67[uVar55 - 3]->g_i = dVar95;
            ppCVar67[uVar55 - 2]->g_i = dVar95;
            iVar62 = 0;
            pCVar12->g_i = dVar95;
          }
        }
        uVar57 = (ulong)uVar55;
        ppCVar60 = ppCVar60 + 1;
        uVar55 = uVar55 + 1;
      } while (uVar57 < uVar56);
    }
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (ppCVar68 != ppCVar67) {
      iVar62 = 0;
      uVar56 = 0;
      uVar57 = 1;
      do {
        if (ppCVar67[uVar56]->active == true) {
          dVar95 = ppCVar67[uVar56]->g_i;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = dVar95;
          if (dVar95 < 0.0) {
            dVar95 = sqrt(dVar95);
          }
          else {
            auVar77 = vsqrtsd_avx(auVar77,auVar77);
            dVar95 = auVar77._0_8_;
          }
          if ((iVar62 < 0) ||
             (lVar59 = (long)iVar62,
             S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
             lVar59)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          iVar62 = iVar62 + 1;
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar59]
               = dVar95;
          ppCVar67 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar68 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        bVar17 = uVar57 < (ulong)((long)ppCVar68 - (long)ppCVar67 >> 3);
        uVar56 = uVar57;
        uVar57 = (ulong)((int)uVar57 + 1);
      } while (bVar17);
    }
    if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar56 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar56 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar56 = uVar56 & 0xfffffffffffffff8;
      if (7 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar59 = 0;
        do {
          auVar69 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (b.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar59),
                                   *(undefined1 (*) [64])
                                    (S.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar59));
          *(undefined1 (*) [64])
           (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar59) = auVar69;
          lVar59 = lVar59 + 8;
        } while (lVar59 < (long)uVar56);
      }
      uVar57 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((long)uVar56 <
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar56]
               = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar56] *
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar56];
          uVar56 = uVar56 + 1;
          uVar57 = S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        } while (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar56);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          uVar57) {
        uVar56 = uVar57 + 7;
        if (-1 < (long)uVar57) {
          uVar56 = uVar57;
        }
        uVar56 = uVar56 & 0xfffffffffffffff8;
        if (7 < (long)uVar57) {
          lVar59 = 0;
          do {
            auVar69 = vdivpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar59),
                                     *(undefined1 (*) [64])
                                      (S.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar59));
            *(undefined1 (*) [64])
             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar59) = auVar69;
            lVar59 = lVar59 + 8;
          } while (lVar59 < (long)uVar56);
        }
        uVar64 = uVar56;
        if ((long)uVar56 < (long)uVar57) {
          do {
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar64] = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar64] /
                       S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar64];
            uVar64 = uVar64 + 1;
          } while (uVar57 != uVar64);
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            uVar57) {
          if (7 < (long)uVar57) {
            lVar59 = 0;
            do {
              auVar69 = vdivpd_avx512f(*(undefined1 (*) [64])
                                        (z.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar59),
                                       *(undefined1 (*) [64])
                                        (S.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar59));
              *(undefined1 (*) [64])
               (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar59) = auVar69;
              lVar59 = lVar59 + 8;
            } while (lVar59 < (long)uVar56);
          }
          if ((long)uVar56 < (long)uVar57) {
            do {
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar56] = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar56] /
                         S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar56];
              uVar56 = uVar56 + 1;
            } while (uVar57 != uVar56);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            uVar56 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 7;
            if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) {
              uVar56 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
            }
            uVar56 = uVar56 & 0xfffffffffffffff8;
            if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              lVar59 = 0;
              do {
                auVar69 = vmulpd_avx512f(*(undefined1 (*) [64])
                                          (y.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar59),
                                         *(undefined1 (*) [64])
                                          (S.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar59));
                *(undefined1 (*) [64])
                 (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 + lVar59) = auVar69;
                lVar59 = lVar59 + 8;
              } while (lVar59 < (long)uVar56);
            }
            if ((long)uVar56 <
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
              do {
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar56] = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar56] *
                           S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar56];
                uVar56 = uVar56 + 1;
              } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows != uVar56);
            }
            goto LAB_007c48a7;
          }
          goto LAB_007c7082;
        }
      }
LAB_007c6c7b:
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007c6fa2;
    }
  }
  else {
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      auVar69 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar71 = vpbroadcastq_avx512f();
      lVar59 = 0;
      do {
        auVar72 = vpbroadcastq_avx512f();
        auVar72 = vporq_avx512f(auVar72,auVar70);
        uVar56 = vpcmpuq_avx512f(auVar72,auVar71,2);
        pdVar16 = S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                  + lVar59;
        bVar17 = (bool)((byte)uVar56 & 1);
        bVar18 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar21 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar56 >> 6) & 1);
        *pdVar16 = (double)((ulong)bVar17 * auVar69._0_8_ | (ulong)!bVar17 * (long)*pdVar16);
        pdVar16[1] = (double)((ulong)bVar18 * auVar69._8_8_ | (ulong)!bVar18 * (long)pdVar16[1]);
        pdVar16[2] = (double)((ulong)bVar19 * auVar69._16_8_ | (ulong)!bVar19 * (long)pdVar16[2]);
        pdVar16[3] = (double)((ulong)bVar20 * auVar69._24_8_ | (ulong)!bVar20 * (long)pdVar16[3]);
        pdVar16[4] = (double)((ulong)bVar21 * auVar69._32_8_ | (ulong)!bVar21 * (long)pdVar16[4]);
        pdVar16[5] = (double)((ulong)bVar22 * auVar69._40_8_ | (ulong)!bVar22 * (long)pdVar16[5]);
        pdVar16[6] = (double)((ulong)bVar23 * auVar69._48_8_ | (ulong)!bVar23 * (long)pdVar16[6]);
        pdVar16[7] = (double)((uVar56 >> 7) * auVar69._56_8_ |
                             (ulong)!SUB81(uVar56 >> 7,0) * (long)pdVar16[7]);
        lVar59 = lVar59 + 8;
      } while (((S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
    }
LAB_007c48a7:
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    {
LAB_007c7060:
      pcVar58 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007c7075:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar58);
    }
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
    {
      auVar69._0_8_ = this->sigma;
      auVar69._8_4_ = this->stepadjust_each;
      auVar69._12_4_ = *(undefined4 *)&this->field_0xec;
      auVar69._16_8_ = this->stepadjust_threshold;
      auVar69._24_8_ = this->stepadjust_maxfactor;
      auVar69._32_4_ = this->stepadjust_type;
      auVar69._36_4_ = *(undefined4 *)&this->field_0x104;
      auVar69._40_8_ = this->tol_prim;
      auVar69._48_8_ = this->tol_dual;
      auVar69._56_4_ = this->acceleration;
      auVar69._60_4_ = *(undefined4 *)&this->field_0x11c;
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar71 = vpbroadcastq_avx512f();
      lVar59 = 0;
      auVar69 = vbroadcastsd_avx512f(auVar69._0_16_);
      do {
        auVar72 = vpbroadcastq_avx512f();
        auVar72 = vporq_avx512f(auVar72,auVar70);
        uVar56 = vpcmpuq_avx512f(auVar72,auVar71,2);
        pdVar16 = vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + lVar59;
        bVar17 = (bool)((byte)uVar56 & 1);
        bVar18 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar21 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar56 >> 6) & 1);
        *pdVar16 = (double)((ulong)bVar17 * auVar69._0_8_ | (ulong)!bVar17 * (long)*pdVar16);
        pdVar16[1] = (double)((ulong)bVar18 * auVar69._8_8_ | (ulong)!bVar18 * (long)pdVar16[1]);
        pdVar16[2] = (double)((ulong)bVar19 * auVar69._16_8_ | (ulong)!bVar19 * (long)pdVar16[2]);
        pdVar16[3] = (double)((ulong)bVar20 * auVar69._24_8_ | (ulong)!bVar20 * (long)pdVar16[3]);
        pdVar16[4] = (double)((ulong)bVar21 * auVar69._32_8_ | (ulong)!bVar21 * (long)pdVar16[4]);
        pdVar16[5] = (double)((ulong)bVar22 * auVar69._40_8_ | (ulong)!bVar22 * (long)pdVar16[5]);
        pdVar16[6] = (double)((ulong)bVar23 * auVar69._48_8_ | (ulong)!bVar23 * (long)pdVar16[6]);
        pdVar16[7] = (double)((uVar56 >> 7) * auVar69._56_8_ |
                             (ulong)!SUB81(uVar56 >> 7,0) * (long)pdVar16[7]);
        lVar59 = lVar59 + 8;
      } while (((vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
    }
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66);
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c7060;
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_1f8;
      auVar69 = vbroadcastsd_avx512f(auVar79);
      auVar70 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar71 = vpbroadcastq_avx512f();
      lVar59 = 0;
      do {
        auVar72 = vpbroadcastq_avx512f();
        auVar72 = vporq_avx512f(auVar72,auVar70);
        uVar56 = vpcmpuq_avx512f(auVar72,auVar71,2);
        pdVar16 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + lVar59;
        bVar17 = (bool)((byte)uVar56 & 1);
        bVar18 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar21 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar56 >> 6) & 1);
        *pdVar16 = (double)((ulong)bVar17 * auVar69._0_8_ | (ulong)!bVar17 * (long)*pdVar16);
        pdVar16[1] = (double)((ulong)bVar18 * auVar69._8_8_ | (ulong)!bVar18 * (long)pdVar16[1]);
        pdVar16[2] = (double)((ulong)bVar19 * auVar69._16_8_ | (ulong)!bVar19 * (long)pdVar16[2]);
        pdVar16[3] = (double)((ulong)bVar20 * auVar69._24_8_ | (ulong)!bVar20 * (long)pdVar16[3]);
        pdVar16[4] = (double)((ulong)bVar21 * auVar69._32_8_ | (ulong)!bVar21 * (long)pdVar16[4]);
        pdVar16[5] = (double)((ulong)bVar22 * auVar69._40_8_ | (ulong)!bVar22 * (long)pdVar16[5]);
        pdVar16[6] = (double)((ulong)bVar23 * auVar69._48_8_ | (ulong)!bVar23 * (long)pdVar16[6]);
        pdVar16[7] = (double)((uVar56 >> 7) * auVar69._56_8_ |
                             (ulong)!SUB81(uVar56 >> 7,0) * (long)pdVar16[7]);
        lVar59 = lVar59 + 8;
      } while (((vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
    }
    ppCVar67 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar59 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar67;
    if (lVar59 != 0) {
      uVar55 = 1;
      uVar56 = 0;
      iVar62 = 0;
      do {
        pCVar12 = ppCVar67[uVar56];
        if (pCVar12->active == true) {
          if (pCVar12->mode == CONSTRAINT_LOCK) {
            if ((iVar62 < 0) ||
               (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                <= iVar62)) goto LAB_007c6f05;
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [iVar62] = this->rho_b;
          }
          iVar62 = iVar62 + 1;
        }
        uVar56 = (ulong)uVar55;
        uVar55 = uVar55 + 1;
      } while (uVar56 < (ulong)(lVar59 >> 3));
    }
    lVar59 = std::chrono::_V2::system_clock::now();
    Eigen::SparseMatrix<double,_1,_int>::resize
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,lVar65,lVar65);
    ChSparsityPatternLearner::ChSparsityPatternLearner
              (&sparsity_pattern,(int)local_2e0,(int)local_2e0);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&local_1e8);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&local_1e8,&B);
    if (this->precond == true) {
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&IS,lVar65);
      if ((int)local_2f0 < 0) goto LAB_007c7060;
      local_370 = 0;
      local_368 = (StorageIndex *)0x1;
      local_378 = (SparseMatrix<double,_1,_int> *)&IS;
      local_360 = pSVar63;
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)pSVar63) {
        pcVar58 = 
        "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
        ;
LAB_007c6ce3:
        local_368 = (StorageIndex *)0x1;
        local_370 = 0;
        __assert_fail("m_xpr.rows() >= other.rows() && m_xpr.cols() >= other.cols() && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x2f,pcVar58);
      }
      local_2a0.m_d.data = (plainobjectbase_evaluator_data<double,_0>)local_350;
      local_2b8._0_8_ = &dstEvaluator;
      local_2b8._8_8_ = &srcEvaluator;
      srcEvaluator.m_functor.m_other = 1.0;
      local_350 = (undefined1  [8])
                  IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_data = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_2a8.m_d.data = (plainobjectbase_evaluator_data<double,_0>)&local_419;
      local_340.m_value = 1;
      vStack_330.m_value = 0;
      vStack_328.m_value = 0;
      CStack_320.m_values =
           (Scalar *)
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_outerStride.m_value =
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_348.m_value = (long)pSVar63;
      pSStack_338 = (SparseMatrix<double,_1,_int> *)&IS;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_2b8);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_378,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      if (((long)&((DenseStorage<double,__1,__1,_1,_0> *)&local_360->_vptr_SparseMatrix)->m_data +
           local_370 !=
           *(long *)&local_378->super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>) ||
         (local_368 != (StorageIndex *)0x1)) {
LAB_007c6d43:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          local_1e8.m_outerSize) {
        pcVar58 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::SparseMatrix<double, 1>, Option = 0]"
        ;
LAB_007c6de0:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar58);
      }
      local_350 = (undefined1  [8])((ulong)local_350 & 0xffffffffffffff00);
      local_348.m_value = local_348.m_value & 0xffffffffffffff00;
      local_340.m_value = (long)&IS;
      pSStack_338 = &local_1e8;
      vStack_330.m_value = (long)&IS;
      if (local_1e8.m_innerSize !=
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, _Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 0]"
        ;
        goto LAB_007c6de0;
      }
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)&local_1e8,
                 (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)local_350);
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, 1>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 1]"
        ;
        goto LAB_007c6de0;
      }
      uVar56 = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
               7;
      if (-1 < IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar56 = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar56 = uVar56 & 0xfffffffffffffff8;
      if (7 < IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar65 = 0;
        do {
          auVar69 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (B.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar65),
                                   *(undefined1 (*) [64])
                                    (IS.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar65));
          *(undefined1 (*) [64])
           (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar65) = auVar69;
          lVar65 = lVar65 + 8;
        } while (lVar65 < (long)uVar56);
      }
      if ((long)uVar56 <
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar56]
               = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar56] *
                 B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar56];
          uVar56 = uVar56 + 1;
        } while (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar56);
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
    }
    peVar13 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_1e8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
        super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
      IVar61 = (peVar13->m_mat).m_outerSize;
      IVar27 = (peVar13->m_mat).m_innerSize;
      (peVar13->m_mat).m_outerSize = local_1e8.m_outerSize;
      (peVar13->m_mat).m_innerSize = local_1e8.m_innerSize;
      pSVar34 = (peVar13->m_mat).m_outerIndex;
      pSVar35 = (peVar13->m_mat).m_innerNonZeros;
      pSVar25 = (peVar13->m_mat).m_data.m_values;
      pSVar33 = (peVar13->m_mat).m_data.m_indices;
      (peVar13->m_mat).m_outerIndex = local_1e8.m_outerIndex;
      (peVar13->m_mat).m_innerNonZeros = local_1e8.m_innerNonZeros;
      (peVar13->m_mat).m_data.m_values = local_1e8.m_data.m_values;
      (peVar13->m_mat).m_data.m_indices = local_1e8.m_data.m_indices;
      IVar28 = (peVar13->m_mat).m_data.m_size;
      IVar29 = (peVar13->m_mat).m_data.m_allocatedSize;
      (peVar13->m_mat).m_data.m_size = local_1e8.m_data.m_size;
      (peVar13->m_mat).m_data.m_allocatedSize = local_1e8.m_data.m_allocatedSize;
      local_1e8.m_outerSize = IVar61;
      local_1e8.m_innerSize = IVar27;
      local_1e8.m_outerIndex = pSVar34;
      local_1e8.m_innerNonZeros = pSVar35;
      local_1e8.m_data.m_values = pSVar25;
      local_1e8.m_data.m_indices = pSVar33;
      local_1e8.m_data.m_size = IVar28;
      local_1e8.m_data.m_allocatedSize = IVar29;
    }
    else {
      pCVar6 = &peVar13->m_mat;
      if (pCVar6 != &local_1e8) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,&local_1e8);
        if (local_1e8.m_innerNonZeros == (StorageIndex *)0x0) {
          sVar7 = (peVar13->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar13->m_mat).m_outerIndex,local_1e8.m_outerIndex,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar13->m_mat).m_data,&local_1e8.m_data);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,&local_1e8);
        }
      }
    }
    IVar61 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar16 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    peVar13 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        ) && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&(peVar13->m_rhs).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows,1),
             (peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows != IVar61)) {
LAB_007c6ea6:
      pcVar58 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007c6ebb:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar58);
    }
    pdVar14 = (peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar56 = IVar61 + 7;
    if (-1 < IVar61) {
      uVar56 = IVar61;
    }
    uVar56 = uVar56 & 0xfffffffffffffff8;
    if (7 < IVar61) {
      lVar65 = 0;
      do {
        pdVar1 = pdVar16 + lVar65;
        dVar95 = pdVar1[1];
        dVar100 = pdVar1[2];
        dVar8 = pdVar1[3];
        dVar36 = pdVar1[4];
        dVar37 = pdVar1[5];
        dVar38 = pdVar1[6];
        dVar39 = pdVar1[7];
        pdVar2 = pdVar14 + lVar65;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar95;
        pdVar2[2] = dVar100;
        pdVar2[3] = dVar8;
        pdVar2[4] = dVar36;
        pdVar2[5] = dVar37;
        pdVar2[6] = dVar38;
        pdVar2[7] = dVar39;
        lVar65 = lVar65 + 8;
      } while (lVar65 < (long)uVar56);
    }
    if ((long)uVar56 < IVar61) {
      do {
        pdVar14[uVar56] = pdVar16[uVar56];
        uVar56 = uVar56 + 1;
      } while (IVar61 != uVar56);
    }
    local_2e0 = local_2e8 & 0xffffffff;
    if (0 < (int)local_2e8) {
      uVar56 = 0;
      do {
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar56) {
LAB_007c6f05:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar95 = this->sigma;
        dVar100 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data[uVar56];
        lVar65 = (long)&((DenseStorage<double,__1,__1,_1,_0> *)&pSVar63->_vptr_SparseMatrix)->m_data
                 + uVar56;
        pSVar52 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                            (&((this->LS_solver).
                               super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_mat,lVar65,lVar65);
        uVar56 = uVar56 + 1;
        *pSVar52 = *pSVar52 - (dVar100 + dVar95);
      } while (local_2e0 != uVar56);
    }
    std::chrono::_V2::system_clock::now();
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar53 = GetLog();
      pCVar54 = ChStreamOutAscii::operator<<
                          (&pCVar53->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      lVar65 = std::chrono::_V2::system_clock::now();
      pCVar54 = ChStreamOutAscii::operator<<(pCVar54,(double)(lVar65 - lVar59) / 1000000000.0);
      ChStreamOutAscii::operator<<(pCVar54,"s\n");
    }
    lVar65 = std::chrono::_V2::system_clock::now();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    std::chrono::_V2::system_clock::now();
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar53 = GetLog();
      pCVar54 = ChStreamOutAscii::operator<<
                          (&pCVar53->super_ChStreamOutAscii," Time for factorize : << ");
      lVar59 = std::chrono::_V2::system_clock::now();
      pCVar54 = ChStreamOutAscii::operator<<(pCVar54,(double)(lVar59 - lVar65) / 1000000000.0);
      ChStreamOutAscii::operator<<(pCVar54,"s\n");
    }
    if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
      uVar55 = 0;
      local_188 = (long)&((DenseStorage<double,__1,__1,_1,_0> *)&pSVar63->_vptr_SparseMatrix)->
                         m_data + uVar66;
      local_180 = (long)(int)(uVar50 | uVar49);
      alignedEnd = uVar66 & 0xfffffffffffffff8;
      local_258 = 10000000000.0;
      local_358 = (Scalar *)0x3ff0000000000000;
      alignedEnd_1 = (Index)((uint)local_2f0 & 0x7ffffff8);
      uVar56 = local_2f0 & 0xffffffff;
      do {
        IVar61 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar16 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if ((l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             != l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
           && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                         (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows,1),
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar61)) goto LAB_007c6ea6;
        IVar27 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar14 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar57 = IVar61 + 7;
        if (-1 < IVar61) {
          uVar57 = IVar61;
        }
        uVar57 = uVar57 & 0xfffffffffffffff8;
        if (7 < IVar61) {
          lVar65 = 0;
          do {
            pdVar1 = pdVar16 + lVar65;
            dVar95 = pdVar1[1];
            dVar100 = pdVar1[2];
            dVar8 = pdVar1[3];
            dVar36 = pdVar1[4];
            dVar37 = pdVar1[5];
            dVar38 = pdVar1[6];
            dVar39 = pdVar1[7];
            pdVar2 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar65;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar95;
            pdVar2[2] = dVar100;
            pdVar2[3] = dVar8;
            pdVar2[4] = dVar36;
            pdVar2[5] = dVar37;
            pdVar2[6] = dVar38;
            pdVar2[7] = dVar39;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)uVar57);
        }
        if ((long)uVar57 < IVar61) {
          do {
            l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar57] = pdVar16[uVar57];
            uVar57 = uVar57 + 1;
          } while (IVar61 != uVar57);
        }
        if ((z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             != z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
           && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                         (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows,1),
              z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar27)) goto LAB_007c6ea6;
        IVar61 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar16 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar57 = IVar27 + 7;
        if (-1 < IVar27) {
          uVar57 = IVar27;
        }
        uVar57 = uVar57 & 0xfffffffffffffff8;
        if (7 < IVar27) {
          lVar65 = 0;
          do {
            pdVar1 = pdVar14 + lVar65;
            dVar95 = pdVar1[1];
            dVar100 = pdVar1[2];
            dVar8 = pdVar1[3];
            dVar36 = pdVar1[4];
            dVar37 = pdVar1[5];
            dVar38 = pdVar1[6];
            dVar39 = pdVar1[7];
            pdVar2 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar65;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar95;
            pdVar2[2] = dVar100;
            pdVar2[3] = dVar8;
            pdVar2[4] = dVar36;
            pdVar2[5] = dVar37;
            pdVar2[6] = dVar38;
            pdVar2[7] = dVar39;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)uVar57);
        }
        if ((long)uVar57 < IVar27) {
          do {
            z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar57] = pdVar14[uVar57];
            uVar57 = uVar57 + 1;
          } while (IVar27 != uVar57);
        }
        if ((y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             != y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
           && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                         (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                          y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows,1),
              y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar61)) goto LAB_007c6ea6;
        IVar27 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar14 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar57 = IVar61 + 7;
        if (-1 < IVar61) {
          uVar57 = IVar61;
        }
        uVar57 = uVar57 & 0xfffffffffffffff8;
        if (7 < IVar61) {
          lVar65 = 0;
          do {
            pdVar1 = pdVar16 + lVar65;
            dVar95 = pdVar1[1];
            dVar100 = pdVar1[2];
            dVar8 = pdVar1[3];
            dVar36 = pdVar1[4];
            dVar37 = pdVar1[5];
            dVar38 = pdVar1[6];
            dVar39 = pdVar1[7];
            pdVar2 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar65;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar95;
            pdVar2[2] = dVar100;
            pdVar2[3] = dVar8;
            pdVar2[4] = dVar36;
            pdVar2[5] = dVar37;
            pdVar2[6] = dVar38;
            pdVar2[7] = dVar39;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)uVar57);
        }
        if ((long)uVar57 < IVar61) {
          do {
            y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar57] = pdVar16[uVar57];
            uVar57 = uVar57 + 1;
          } while (IVar61 != uVar57);
        }
        if ((v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             != v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
           && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                         (&v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                          v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows,1),
              v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != IVar27)) goto LAB_007c6ea6;
        IVar61 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar2 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar1 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar16 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar57 = IVar27 + 7;
        if (-1 < IVar27) {
          uVar57 = IVar27;
        }
        uVar57 = uVar57 & 0xfffffffffffffff8;
        if (7 < IVar27) {
          lVar65 = 0;
          do {
            pdVar3 = pdVar14 + lVar65;
            dVar95 = pdVar3[1];
            dVar100 = pdVar3[2];
            dVar8 = pdVar3[3];
            dVar36 = pdVar3[4];
            dVar37 = pdVar3[5];
            dVar38 = pdVar3[6];
            dVar39 = pdVar3[7];
            pdVar4 = v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar65;
            *pdVar4 = *pdVar3;
            pdVar4[1] = dVar95;
            pdVar4[2] = dVar100;
            pdVar4[3] = dVar8;
            pdVar4[4] = dVar36;
            pdVar4[5] = dVar37;
            pdVar4[6] = dVar38;
            pdVar4[7] = dVar39;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)uVar57);
        }
        if ((long)uVar57 < IVar27) {
          do {
            v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar57] = pdVar14[uVar57];
            uVar57 = uVar57 + 1;
          } while (IVar27 != uVar57);
        }
        if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007c6c7b;
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007c6fa2;
        }
        if ((z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
             y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1),
           z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           IVar61)) {
          pcVar58 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007c6ebb;
        }
        uVar57 = IVar61 + 7;
        if (-1 < IVar61) {
          uVar57 = IVar61;
        }
        uVar57 = uVar57 & 0xfffffffffffffff8;
        if (7 < IVar61) {
          lVar65 = 0;
          do {
            auVar69 = vdivpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar65),
                                     *(undefined1 (*) [64])(pdVar1 + lVar65));
            auVar69 = vaddpd_avx512f(auVar69,*(undefined1 (*) [64])(pdVar16 + lVar65));
            *(undefined1 (*) [64])
             (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar65) = auVar69;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)uVar57);
        }
        if ((long)uVar57 < IVar61) {
          do {
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar57] = pdVar2[uVar57] / pdVar1[uVar57] + pdVar16[uVar57];
            uVar57 = uVar57 + 1;
          } while (IVar61 != uVar57);
        }
        (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&z);
        if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c6fa2;
        }
        if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c6fa2;
        }
        if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007c6fa2;
        }
        if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c6fa2;
        }
        srcEvaluator.m_functor.m_other = 0.0;
        srcEvaluator._8_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                   vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_rows,1);
        pdVar3 = vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar2 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        IVar61 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pdVar1 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar14 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        pdVar16 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        if ((srcEvaluator._8_8_ !=
             y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,1), srcEvaluator._8_8_ != IVar61)) {
          pcVar58 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007c6ebb;
        }
        uVar57 = IVar61 + 7;
        if (-1 < IVar61) {
          uVar57 = IVar61;
        }
        if (7 < IVar61) {
          lVar65 = 0;
          do {
            auVar69 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(pdVar2 + lVar65));
            auVar70 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar65),
                                     *(undefined1 (*) [64])(pdVar14 + lVar65));
            auVar70 = vmulpd_avx512f(auVar70,*(undefined1 (*) [64])(pdVar16 + lVar65));
            auVar69 = vaddpd_avx512f(auVar69,auVar70);
            auVar69 = vsubpd_avx512f(auVar69,*(undefined1 (*) [64])(pdVar1 + lVar65));
            *(undefined1 (*) [64])((long)srcEvaluator.m_functor.m_other + lVar65 * 8) = auVar69;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)(uVar57 & 0xfffffffffffffff8));
        }
        if ((long)(uVar57 & 0xfffffffffffffff8) < IVar61) {
          lVar65 = (long)uVar57 >> 3;
          lVar59 = 0;
          do {
            *(double *)((long)srcEvaluator.m_functor.m_other + lVar65 * 0x40 + lVar59 * 8) =
                 ((pdVar3[lVar65 * 8 + lVar59] + pdVar14[lVar65 * 8 + lVar59]) *
                  pdVar16[lVar65 * 8 + lVar59] - pdVar2[lVar65 * 8 + lVar59]) -
                 pdVar1[lVar65 * 8 + lVar59];
            lVar59 = lVar59 + 1;
          } while (IVar61 % 8 != lVar59);
        }
        peVar13 = (this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_378 = (SparseMatrix<double,_1,_int> *)&peVar13->m_rhs;
        local_370 = 0;
        local_368 = (StorageIndex *)0x1;
        local_360 = (SparseMatrix<double,_1,_int> *)
                    k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows;
        pCVar15 = (ChVectorDynamic<> *)
                  (peVar13->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
        if ((long)pCVar15 <
            k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c6ce3;
        }
        local_350 = (undefined1  [8])
                    (((ChVectorDynamic<double> *)local_378)->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        ;
        local_348.m_value =
             k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_340.m_value = 1;
        if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
            local_350 != (undefined1  [8])0x0) {
LAB_007c6d64:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        vStack_330.m_value = 0;
        vStack_328.m_value = 0;
        pSStack_338 = local_378;
        CStack_320.m_values = (Scalar *)pCVar15;
        if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0) {
LAB_007c6da9:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        local_2b8._0_8_ = &dstEvaluator;
        local_2b8._8_8_ = &IS;
        local_2a8.m_d.data = (plainobjectbase_evaluator_data<double,_0>)&local_419;
        local_2a0.m_d.data = (plainobjectbase_evaluator_data<double,_0>)local_350;
        IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        dstEvaluator.
        super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
        .m_data = (PointerType)local_350;
        dstEvaluator.
        super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
        .m_outerStride.m_value = (long)pCVar15;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_2b8);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_378,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator);
        if (((long)&((DenseStorage<double,__1,__1,_1,_0> *)&local_360->_vptr_SparseMatrix)->m_data +
             local_370 !=
             *(long *)&local_378->super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>)
           || (local_368 != (StorageIndex *)0x1)) goto LAB_007c6d43;
        lVar65 = std::chrono::_V2::system_clock::now();
        (*(((this->LS_solver).
            super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
        std::chrono::_V2::system_clock::now();
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar53 = GetLog();
          pCVar54 = ChStreamOutAscii::operator<<
                              (&pCVar53->super_ChStreamOutAscii," Time for solve : << ");
          lVar59 = std::chrono::_V2::system_clock::now();
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,(double)(lVar59 - lVar65) / 1000000000.0);
          ChStreamOutAscii::operator<<(pCVar54,"s\n");
        }
        peVar13 = (this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pdVar16 = (peVar13->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        if (pdVar16 != (double *)0x0 && (int)local_2e8 < 0) goto LAB_007c6d64;
        if ((local_180 < 0) ||
           ((peVar13->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows < local_188)) goto LAB_007c6da9;
        if ((l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
             uVar66) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar66,1),
           l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           uVar66)) {
          pcVar58 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007c6ebb;
        }
        if (0 < alignedEnd) {
          lVar65 = 0;
          do {
            auVar69 = vsubpd_avx512f(ZEXT864(0) << 0x40,
                                     *(undefined1 (*) [64])
                                      (pdVar16 +
                                      (long)&((DenseStorage<double,__1,__1,_1,_0> *)
                                             &pSVar63->_vptr_SparseMatrix)->m_data + lVar65));
            *(undefined1 (*) [64])
             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar65) = auVar69;
            lVar65 = lVar65 + 8;
          } while (lVar65 < alignedEnd);
        }
        IVar61 = alignedEnd;
        if (alignedEnd != uVar66) {
          do {
            auVar76._0_8_ =
                 -pdVar16[(long)&((DenseStorage<double,__1,__1,_1,_0> *)&pSVar63->_vptr_SparseMatrix
                                 )->m_data + IVar61];
            auVar76._8_8_ = 0x8000000000000000;
            dVar95 = (double)vmovlpd_avx(auVar76);
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [IVar61] = dVar95;
            IVar61 = IVar61 + 1;
          } while (IVar61 < (long)uVar66);
        }
        peVar13 = (this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pdVar16 = (peVar13->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        if (pdVar16 != (double *)0x0 && (int)local_2f0 < 0) goto LAB_007c6d64;
        if (((int)local_2f0 < 0) ||
           ((peVar13->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows < (long)pSVar63)) goto LAB_007c6da9;
        if (((SparseMatrix<double,_1,_int> *)
             v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
             pSVar63) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       (Index)pSVar63,1),
           (SparseMatrix<double,_1,_int> *)
           v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           pSVar63)) {
          pcVar58 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_007c6ebb;
        }
        if (alignedEnd_1 != 0) {
          uVar57 = 0;
          do {
            pdVar14 = pdVar16 + uVar57;
            dVar95 = pdVar14[1];
            dVar100 = pdVar14[2];
            dVar8 = pdVar14[3];
            dVar36 = pdVar14[4];
            dVar37 = pdVar14[5];
            dVar38 = pdVar14[6];
            dVar39 = pdVar14[7];
            pdVar1 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + uVar57;
            *pdVar1 = *pdVar14;
            pdVar1[1] = dVar95;
            pdVar1[2] = dVar100;
            pdVar1[3] = dVar8;
            pdVar1[4] = dVar36;
            pdVar1[5] = dVar37;
            pdVar1[6] = dVar38;
            pdVar1[7] = dVar39;
            uVar57 = uVar57 + 8;
          } while (uVar57 < (ulong)alignedEnd_1);
        }
        IVar61 = alignedEnd_1;
        if ((SparseMatrix<double,_1,_int> *)alignedEnd_1 != pSVar63) {
          do {
            v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [IVar61] = pdVar16[IVar61];
            IVar61 = IVar61 + 1;
          } while (IVar61 < (long)pSVar63);
        }
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007c6f8d;
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Option = 1]"
          ;
          goto LAB_007c6de0;
        }
        if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>]"
          ;
          goto LAB_007c6fa2;
        }
        uVar57 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 7;
        if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          uVar57 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        }
        uVar57 = uVar57 & 0xfffffffffffffff8;
        if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar65 = 0;
          do {
            auVar69 = vsubpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar65),
                                     *(undefined1 (*) [64])
                                      (z.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar65));
            auVar69 = vmulpd_avx512f(auVar69,*(undefined1 (*) [64])
                                              (vrho.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar65));
            auVar69 = vaddpd_avx512f(auVar69,*(undefined1 (*) [64])
                                              (y.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar65));
            *(undefined1 (*) [64])
             (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar65) = auVar69;
            lVar65 = lVar65 + 8;
          } while (lVar65 < (long)uVar57);
        }
        if ((long)uVar57 <
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar57] = (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data[uVar57] -
                       z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar57]) *
                       vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       .m_data[uVar57] +
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar57];
            uVar57 = uVar57 + 1;
          } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar57);
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007c6f8d;
        }
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
LAB_007c6e0e:
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c6fa2;
        }
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
        {
          local_340.m_value = (long)&z;
          vStack_328.m_value = (long)&S;
          pSStack_338 = (SparseMatrix<double,_1,_int> *)&l;
          if (0 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            local_2a0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_298.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            local_290.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            SVar73 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_2b8,(scalar_max_op<double,_double,_0> *)&local_378,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_350);
            this->r_prim = SVar73;
            if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
            goto LAB_007c6f8d;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                0) goto LAB_007c59d7;
            local_348.m_value = (long)&z;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar58 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              local_340.m_value = (long)&l;
              goto LAB_007c6f78;
            }
            local_2a8.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_2a0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_340.m_value = (long)&l;
            local_3b8 = (Scalar *)
                        Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_2b8,(scalar_max_op<double,_double,_0> *)&local_378,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)local_350);
            IVar61 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
            goto LAB_007c59e6;
          }
LAB_007c6f3e:
          pcVar58 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
          ;
          goto LAB_007c6f78;
        }
        this->r_prim = 0.0;
LAB_007c59d7:
        IVar61 = 0;
        local_3b8 = (Scalar *)0x0;
LAB_007c59e6:
        if (IVar61 != l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_rows) goto LAB_007c6f8d;
        if (IVar61 != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) goto LAB_007c6e0e;
        if (IVar61 != S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c6fa2;
        }
        if (IVar61 == 0) {
          this->r_dual = 0.0;
          local_3a0 = 0.0;
          if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != 0) goto LAB_007c6e0e;
        }
        else {
          vStack_330.m_value = (long)&l_old;
          CStack_320.m_values = (Scalar *)&vrho;
          CStack_320.m_size = (Index)&S;
          if (IVar61 < 1) {
            pcVar58 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
            ;
            pSStack_338 = (SparseMatrix<double,_1,_int> *)&l;
            goto LAB_007c6f78;
          }
          local_298.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_290.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
          local_288.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
          local_280.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          pSStack_338 = (SparseMatrix<double,_1,_int> *)&l;
          SVar74 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_2b8,(scalar_max_op<double,_double,_0> *)&local_378,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_350);
          this->r_dual = SVar74;
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007c6f8d;
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) goto LAB_007c6e0e;
          if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              == 0) {
            local_3a0 = 0.0;
          }
          else {
            pSStack_338 = (SparseMatrix<double,_1,_int> *)&l_old;
            vStack_328.m_value = (long)&vrho;
            local_340.m_value = (long)&l;
            if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows < 1) goto LAB_007c6f3e;
            local_2a0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_298.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
            local_290.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
            local_3a0 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_2b8,(scalar_max_op<double,_double,_0> *)&local_378,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)local_350);
          }
        }
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar53 = GetLog();
          pCVar54 = ChStreamOutAscii::operator<<(&pCVar53->super_ChStreamOutAscii,"ADMMfast iter=");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,uVar55);
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54," prim=");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,this->r_prim);
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54," dual=");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,this->r_dual);
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,"  rho=");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,local_1f8);
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54," alpha=");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,(double)local_358);
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,"  tols=");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,this->tol_prim);
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54," ");
          pCVar54 = ChStreamOutAscii::operator<<(pCVar54,this->tol_dual);
          ChStreamOutAscii::operator<<(pCVar54,"\n");
        }
        if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007c6f8d;
          dVar95 = this->rho;
          local_348.m_value = (long)&y;
          local_340.m_value = (long)&y_old;
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0
             ) {
            if (0 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              local_2a8.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              local_2a0.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
              auVar70._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_2b8,(scalar_sum_op<double,_double> *)&local_378,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_350);
              auVar70._8_56_ = extraout_var_00;
              auVar77 = auVar70._0_16_;
              dVar100 = this->rho;
              goto LAB_007c5d2a;
            }
LAB_007c6f63:
            pcVar58 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            goto LAB_007c6f78;
          }
          auVar77 = SUB6416(ZEXT864(0),0) << 0x40;
          dVar100 = dVar95;
LAB_007c5d2a:
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            local_340.m_value = (long)&l_old;
            auVar105._0_8_ = 1.0 / dVar95;
            auVar105._8_8_ = 0;
            auVar77 = vsqrtsd_avx(auVar77,auVar77);
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                0) {
              auVar79 = SUB6416(ZEXT864(0),0) << 0x40;
              auVar96._8_8_ = 0;
              auVar96._0_8_ = dVar100 * 0.0;
              auVar77 = vfmadd213sd_fma(auVar77,auVar105,auVar96);
              dVar95 = auVar77._0_8_;
              local_348.m_value = (long)&l;
            }
            else {
              auVar101._0_8_ = auVar77._0_8_;
              local_348.m_value = (long)&l;
              local_2f8 = dVar100;
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  < 1) goto LAB_007c6f63;
              local_2a8.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              ;
              local_2a0.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
              auVar71._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_2b8,(scalar_sum_op<double,_double> *)&local_378,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_350);
              auVar71._8_56_ = extraout_var_01;
              auVar101._8_8_ = 0;
              auVar103._8_8_ = 0;
              auVar103._0_8_ = auVar105._0_8_;
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) goto LAB_007c6f8d;
              auVar77 = vsqrtsd_avx(auVar71._0_16_,auVar71._0_16_);
              local_340.m_value = (long)&l_old;
              auVar78._8_8_ = 0;
              auVar78._0_8_ = local_2f8 * auVar77._0_8_;
              auVar77 = vfmadd213sd_fma(auVar101,auVar103,auVar78);
              dVar95 = auVar77._0_8_;
              if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows == 0) {
                auVar79 = ZEXT816(0);
                local_348.m_value = (long)&l;
              }
              else {
                local_348.m_value = (long)&l;
                if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007c6f63;
                local_2a8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)
                     l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data;
                local_2a0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)
                     l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data;
                auVar72._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_2b8,(scalar_sum_op<double,_double> *)&local_378,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_350);
                auVar72._8_56_ = extraout_var_02;
                auVar79 = auVar72._0_16_;
              }
            }
            auVar77 = vsqrtsd_avx(auVar79,auVar79);
            ChIterativeSolverVI::AtIterationEnd
                      (&this->super_ChIterativeSolverVI,dVar95,auVar77._0_8_,uVar55);
            goto LAB_007c5e88;
          }
          goto LAB_007c6f8d;
        }
LAB_007c5e88:
        if ((this->tol_prim <= this->r_prim) || (this->tol_dual <= this->r_dual)) {
          if (1 < uVar55) {
            if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
              dVar95 = this->rho;
              local_348.m_value = (long)&y;
              local_340.m_value = (long)&y_old;
              if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  == 0) {
                auVar80 = (undefined1  [16])0x0;
                dVar100 = dVar95;
              }
              else {
                if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007c6f63;
                local_2a8.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data;
                local_2a0.m_d.data =
                     (plainobjectbase_evaluator_data<double,_0>)
                     (plainobjectbase_evaluator_data<double,_0>)
                     y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data;
                auVar88._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_2b8,(scalar_sum_op<double,_double> *)&local_378,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_350);
                auVar88._8_56_ = extraout_var_03;
                auVar80 = auVar88._0_16_;
                dVar100 = this->rho;
              }
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  == l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) {
                local_340.m_value = (long)&l_old;
                if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows == 0) {
                  auVar77 = ZEXT816(0) << 0x40;
                  local_348.m_value = (long)&l;
                }
                else {
                  local_2f8 = auVar80._0_8_;
                  local_348.m_value = (long)&l;
                  if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows < 1) goto LAB_007c6f63;
                  local_2a8.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)
                       l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
                  local_2a0.m_d.data =
                       (plainobjectbase_evaluator_data<double,_0>)
                       (plainobjectbase_evaluator_data<double,_0>)
                       l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
                  auVar89._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                   *)local_2b8,(scalar_sum_op<double,_double> *)&local_378,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)local_350);
                  auVar89._8_56_ = extraout_var_04;
                  auVar77 = auVar89._0_16_;
                  auVar80._8_8_ = 0;
                  auVar80._0_8_ = local_2f8;
                }
                auVar77 = vsqrtsd_avx(auVar77,auVar77);
                auVar79 = vsqrtsd_avx(auVar80,auVar80);
                auVar97._0_8_ = 1.0 / dVar95;
                auVar97._8_8_ = 0;
                auVar81._8_8_ = 0;
                auVar81._0_8_ = dVar100 * auVar77._0_8_;
                auVar77 = vfmadd213sd_fma(auVar79,auVar97,auVar81);
                dVar95 = local_258 * 0.9999;
                local_258 = auVar77._0_8_;
                if (dVar95 <= local_258) {
                  if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose ==
                      true) {
                    pCVar53 = GetLog();
                    pCVar54 = ChStreamOutAscii::operator<<
                                        (&pCVar53->super_ChStreamOutAscii,
                                         "ADMMfast Nesterov restart.");
                    pCVar54 = ChStreamOutAscii::operator<<(pCVar54,uVar55);
                    ChStreamOutAscii::operator<<(pCVar54,"\n");
                  }
                  local_258 = local_258 * 1.000100010001;
                  local_358 = (Scalar *)0x3ff0000000000000;
                  goto LAB_007c6306;
                }
                auVar82._8_8_ = 0;
                auVar82._0_8_ = (double)local_358 * (double)local_358;
                auVar77 = vfmadd132sd_fma(auVar82,ZEXT816(0x3ff0000000000000),
                                          ZEXT816(0x4010000000000000));
                if (auVar77._0_8_ < 0.0) {
                  dVar95 = sqrt(auVar77._0_8_);
                }
                else {
                  auVar77 = vsqrtsd_avx(auVar77,auVar77);
                  dVar95 = auVar77._0_8_;
                }
                pSVar25 = (Scalar *)((dVar95 + 1.0) * 0.5);
                if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows == l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows) {
                  if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows) {
                    auVar98._0_8_ = ((double)local_358 + -1.0) / (double)pSVar25;
                    auVar98._8_8_ = 0;
                    uVar57 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows & 0x7ffffffffffffff8;
                    if (7 < (ulong)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows) {
                      auVar69 = vbroadcastsd_avx512f(auVar98);
                      uVar64 = 0;
                      do {
                        auVar70 = vsubpd_avx512f(*(undefined1 (*) [64])
                                                  (l.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64),
                                                 *(undefined1 (*) [64])
                                                  (l_old.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64));
                        auVar70 = vmulpd_avx512f(auVar69,auVar70);
                        auVar70 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                  (l.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64),auVar70);
                        *(undefined1 (*) [64])
                         (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data + uVar64) = auVar70;
                        uVar64 = uVar64 + 8;
                      } while (uVar64 < uVar57);
                    }
                    if ((long)uVar57 <
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
                      do {
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data[uVar57] =
                             l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[uVar57] +
                             auVar98._0_8_ *
                             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data[uVar57] -
                             l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data[uVar57]);
                        uVar57 = uVar57 + 1;
                      } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows != uVar57);
                    }
                    if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows != v_old.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows) goto LAB_007c6f8d;
                    if (-1 < v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows) {
                      uVar57 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows & 0x7ffffffffffffff8;
                      if (7 < (ulong)v.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_rows) {
                        auVar69 = vbroadcastsd_avx512f(auVar98);
                        uVar64 = 0;
                        do {
                          auVar70 = vsubpd_avx512f(*(undefined1 (*) [64])
                                                    (v.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64),
                                                  *(undefined1 (*) [64])
                                                   (v_old.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64));
                          auVar70 = vmulpd_avx512f(auVar69,auVar70);
                          auVar70 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                    (v.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64),auVar70);
                          *(undefined1 (*) [64])
                           (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data + uVar64) = auVar70;
                          uVar64 = uVar64 + 8;
                        } while (uVar64 < uVar57);
                      }
                      if ((long)uVar57 <
                          v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows) {
                        do {
                          v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data[uVar57] =
                               v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[uVar57] +
                               auVar98._0_8_ *
                               (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data[uVar57] -
                               v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data[uVar57]);
                          uVar57 = uVar57 + 1;
                        } while (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows != uVar57);
                      }
                      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows !=
                          y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows) goto LAB_007c6f8d;
                      if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows) {
                        uVar57 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows & 0x7ffffffffffffff8;
                        if (7 < (ulong)y.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_rows) {
                          auVar69 = vbroadcastsd_avx512f(auVar98);
                          uVar64 = 0;
                          do {
                            auVar70 = vsubpd_avx512f(*(undefined1 (*) [64])
                                                      (y.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64),
                                                  *(undefined1 (*) [64])
                                                   (y_old.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64));
                            auVar70 = vmulpd_avx512f(auVar69,auVar70);
                            auVar70 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                      (y.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data + uVar64),auVar70);
                            *(undefined1 (*) [64])
                             (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + uVar64) = auVar70;
                            uVar64 = uVar64 + 8;
                          } while (uVar64 < uVar57);
                        }
                        local_358 = pSVar25;
                        if ((long)uVar57 <
                            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows) {
                          do {
                            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data[uVar57] =
                                 y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data[uVar57] +
                                 auVar98._0_8_ *
                                 (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data[uVar57] -
                                 y_old.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_data[uVar57]);
                            uVar57 = uVar57 + 1;
                          } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_rows != uVar57);
                        }
                        goto LAB_007c6306;
                      }
                    }
                  }
                  pcVar58 = 
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                  ;
                  goto LAB_007c7075;
                }
              }
            }
LAB_007c6f8d:
            pcVar58 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007c6fa2;
          }
LAB_007c6306:
          bVar17 = true;
          if ((int)uVar55 % this->stepadjust_each != 0) goto LAB_007c67f6;
          auVar77 = ZEXT816(0x3ff0000000000000);
          AVar51 = this->stepadjust_type;
          if (AVar51 == BALANCED_UNSCALED) {
            auVar83._0_8_ = (double)local_3b8 / local_3a0;
            auVar83._8_8_ = 0;
            if (auVar83._0_8_ < 0.0) {
              auVar90._0_8_ = sqrt(auVar83._0_8_);
              auVar90._8_56_ = extraout_var_05;
              auVar77 = auVar90._0_16_;
            }
            else {
              auVar77 = vsqrtsd_avx(auVar83,auVar83);
            }
            AVar51 = this->stepadjust_type;
          }
          if (AVar51 == BALANCED_FAST) {
            auVar84 = ZEXT816(0) << 0x40;
            auVar85 = ZEXT816(0) << 0x40;
            if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                0) {
              local_2b8._0_8_ = &z;
              if (0 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) {
                local_348.m_value =
                     (long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                auVar91._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_350,(scalar_max_op<double,_double,_0> *)&local_378,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)local_2b8);
                auVar91._8_56_ = extraout_var_06;
                auVar85 = auVar91._0_16_;
                auVar84 = ZEXT816(0);
                goto LAB_007c63cb;
              }
LAB_007c6fe1:
              pcVar58 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
LAB_007c6f78:
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar58);
            }
LAB_007c63cb:
            auVar99._0_8_ = auVar85._0_8_;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                0) {
              local_2b8._0_8_ = (SparseMatrix<double,_1,_int> *)&l;
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  < 1) goto LAB_007c6fe1;
              local_348.m_value =
                   (long)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
              auVar92._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_350,(scalar_max_op<double,_double,_0> *)&local_378,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                               *)local_2b8);
              auVar92._8_56_ = extraout_var_07;
              auVar84 = auVar92._0_16_;
              auVar99._8_8_ = 0;
              auVar85 = auVar99;
            }
            dVar95 = 1e-10;
            if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                0) {
              local_2b8._0_8_ = &y;
              local_2f8 = auVar84._0_8_;
              if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  < 1) goto LAB_007c6fe1;
              local_348.m_value =
                   (long)y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
              SVar75 = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)local_350,(scalar_max_op<double,_double,_0> *)&local_378,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                   *)local_2b8);
              auVar85._8_8_ = 0;
              auVar85._0_8_ = auVar99._0_8_;
              dVar95 = SVar75 + 1e-10;
              auVar84._8_8_ = 0;
              auVar84._0_8_ = local_2f8;
            }
            auVar77 = vmaxsd_avx(auVar85,auVar84);
            auVar86._0_8_ =
                 ((double)local_3b8 / (auVar77._0_8_ + 1e-10)) / (local_3a0 / dVar95 + 1e-10);
            auVar86._8_8_ = 0;
            if (auVar86._0_8_ < 0.0) {
              auVar93._0_8_ = sqrt(auVar86._0_8_);
              auVar93._8_56_ = extraout_var_08;
              auVar77 = auVar93._0_16_;
            }
            else {
              auVar77 = vsqrtsd_avx(auVar86,auVar86);
            }
            AVar51 = this->stepadjust_type;
          }
          if (AVar51 == BALANCED_RANGE) {
            auVar9._0_8_ = this->r_prim;
            auVar9._8_8_ = this->r_dual;
            auVar10._0_8_ = this->tol_prim;
            auVar10._8_8_ = this->tol_dual;
            auVar77 = vdivpd_avx(auVar9,auVar10);
            auVar79 = vshufpd_avx(auVar77,auVar77,1);
            auVar87._0_8_ = auVar77._0_8_ / (auVar79._0_8_ + 1e-10);
            auVar87._8_8_ = auVar77._8_8_;
            if (auVar87._0_8_ < 0.0) {
              auVar94._0_8_ = sqrt(auVar87._0_8_);
              auVar94._8_56_ = extraout_var_09;
              auVar77 = auVar94._0_16_;
            }
            else {
              auVar77 = vsqrtsd_avx(auVar87,auVar87);
            }
          }
          auVar102._8_8_ = 0;
          auVar102._0_8_ = this->stepadjust_maxfactor;
          auVar104._0_8_ = 1.0 / this->stepadjust_maxfactor;
          auVar104._8_8_ = 0;
          auVar77 = vmaxsd_avx(auVar104,auVar77);
          auVar77 = vminsd_avx(auVar102,auVar77);
          dVar95 = auVar77._0_8_;
          if ((this->stepadjust_threshold < dVar95) || (dVar95 < 1.0 / this->stepadjust_threshold))
          {
            lVar65 = std::chrono::_V2::system_clock::now();
            if (0 < (int)local_2e8) {
              uVar57 = 0;
              do {
                if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows <= (long)uVar57) goto LAB_007c6f05;
                dVar100 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[uVar57];
                dVar8 = this->sigma;
                lVar59 = uVar56 + uVar57;
                pSVar52 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                    (&((this->LS_solver).
                                       super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->m_mat,lVar59,lVar59);
                uVar57 = uVar57 + 1;
                *pSVar52 = dVar100 + dVar8 + *pSVar52;
              } while (local_2e0 != uVar57);
            }
            if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                < 0) goto LAB_007c7060;
            auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            local_1f8 = local_1f8 * dVar95;
            if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                != 0) {
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_1f8;
              auVar70 = vbroadcastsd_avx512f(auVar11);
              auVar71 = vpbroadcastq_avx512f();
              lVar59 = 0;
              do {
                auVar72 = vpbroadcastq_avx512f();
                auVar72 = vporq_avx512f(auVar72,auVar69);
                uVar57 = vpcmpuq_avx512f(auVar72,auVar71,2);
                pdVar16 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data + lVar59;
                bVar18 = (bool)((byte)uVar57 & 1);
                bVar19 = (bool)((byte)(uVar57 >> 1) & 1);
                bVar20 = (bool)((byte)(uVar57 >> 2) & 1);
                bVar21 = (bool)((byte)(uVar57 >> 3) & 1);
                bVar22 = (bool)((byte)(uVar57 >> 4) & 1);
                bVar23 = (bool)((byte)(uVar57 >> 5) & 1);
                bVar24 = (bool)((byte)(uVar57 >> 6) & 1);
                *pdVar16 = (double)((ulong)bVar18 * auVar70._0_8_ | (ulong)!bVar18 * (long)*pdVar16)
                ;
                pdVar16[1] = (double)((ulong)bVar19 * auVar70._8_8_ |
                                     (ulong)!bVar19 * (long)pdVar16[1]);
                pdVar16[2] = (double)((ulong)bVar20 * auVar70._16_8_ |
                                     (ulong)!bVar20 * (long)pdVar16[2]);
                pdVar16[3] = (double)((ulong)bVar21 * auVar70._24_8_ |
                                     (ulong)!bVar21 * (long)pdVar16[3]);
                pdVar16[4] = (double)((ulong)bVar22 * auVar70._32_8_ |
                                     (ulong)!bVar22 * (long)pdVar16[4]);
                pdVar16[5] = (double)((ulong)bVar23 * auVar70._40_8_ |
                                     (ulong)!bVar23 * (long)pdVar16[5]);
                pdVar16[6] = (double)((ulong)bVar24 * auVar70._48_8_ |
                                     (ulong)!bVar24 * (long)pdVar16[6]);
                pdVar16[7] = (double)((uVar57 >> 7) * auVar70._56_8_ |
                                     (ulong)!SUB81(uVar57 >> 7,0) * (long)pdVar16[7]);
                lVar59 = lVar59 + 8;
              } while (((vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
                       (ulong)((uint)(vrho.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
            }
            ppCVar67 = (sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            lVar59 = (long)(sysd->vconstraints).
                           super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar67;
            if (lVar59 != 0) {
              uVar49 = 1;
              uVar57 = 0;
              iVar62 = 0;
              do {
                pCVar12 = ppCVar67[uVar57];
                if (pCVar12->active == true) {
                  if (pCVar12->mode == CONSTRAINT_LOCK) {
                    if ((iVar62 < 0) ||
                       (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows <= iVar62)) goto LAB_007c6f05;
                    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data[iVar62] = this->rho_b;
                  }
                  iVar62 = iVar62 + 1;
                }
                uVar57 = (ulong)uVar49;
                uVar49 = uVar49 + 1;
              } while (uVar57 < (ulong)(lVar59 >> 3));
            }
            if (0 < (int)local_2e8) {
              uVar57 = 0;
              do {
                if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows <= (long)uVar57) goto LAB_007c6f05;
                dVar95 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_data[uVar57];
                dVar100 = this->sigma;
                lVar59 = uVar56 + uVar57;
                pSVar52 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                    (&((this->LS_solver).
                                       super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->m_mat,lVar59,lVar59);
                uVar57 = uVar57 + 1;
                *pSVar52 = *pSVar52 - (dVar95 + dVar100);
              } while (local_2e0 != uVar57);
            }
            (*(((this->LS_solver).
                super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
            std::chrono::_V2::system_clock::now();
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar53 = GetLog();
              pCVar54 = ChStreamOutAscii::operator<<
                                  (&pCVar53->super_ChStreamOutAscii," Time for re-factorize : << ");
              lVar59 = std::chrono::_V2::system_clock::now();
              pCVar54 = ChStreamOutAscii::operator<<
                                  (pCVar54,(double)(lVar59 - lVar65) / 1000000000.0);
              ChStreamOutAscii::operator<<(pCVar54,"s\n");
            }
          }
        }
        else {
          if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
            pCVar53 = GetLog();
            pCVar54 = ChStreamOutAscii::operator<<
                                (&pCVar53->super_ChStreamOutAscii,"ADMMfast converged ok! at iter=")
            ;
            pCVar54 = ChStreamOutAscii::operator<<(pCVar54,uVar55);
            ChStreamOutAscii::operator<<(pCVar54,"\n");
          }
          bVar17 = false;
        }
LAB_007c67f6:
        if (srcEvaluator.m_functor.m_other != 0.0) {
          free(*(void **)((long)srcEvaluator.m_functor.m_other + -8));
        }
      } while ((bVar17) &&
              (uVar55 = uVar55 + 1,
              (int)uVar55 <
              (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations));
    }
    if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar66 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar66 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar66 = uVar66 & 0xfffffffffffffff8;
      if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar65 = 0;
        do {
          auVar69 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (l.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar65),
                                   *(undefined1 (*) [64])
                                    (S.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar65));
          *(undefined1 (*) [64])
           (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar65) = auVar69;
          lVar65 = lVar65 + 8;
        } while (lVar65 < (long)uVar66);
      }
      if ((long)uVar66 <
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar66]
               = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar66] *
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar66];
          uVar66 = uVar66 + 1;
        } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar66);
      }
      (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&l);
      (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&v);
      local_450 = this->r_dual;
      ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
      if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_data[-1]);
      }
      if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)v_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      local_1e8._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(local_1e8.m_outerIndex);
      free(local_1e8.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_1e8.m_data);
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(E.m_outerIndex);
      free(E.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&E.m_data);
      Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(Cq.m_outerIndex);
      free(Cq.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&Cq.m_data);
LAB_007c6c3e:
      if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      return local_450;
    }
  }
LAB_007c7082:
  pcVar58 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
LAB_007c6fa2:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar58);
}

Assistant:

double ChSolverADMM::_SolveFast(ChSystemDescriptor& sysd) {

    // For Nesterov:
    double nalpha = 1.0; 
    double c_k = 1e10;
    double eta = 0.9999;

    ChTimer<> m_timer_convert;
    ChTimer<> m_timer_factorize;
    ChTimer<> m_timer_solve;

    double rho_i = this->rho;

    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();

    int nc = sysd.CountActiveConstraints();
    int nv = sysd.CountActiveVariables();

    ChVectorDynamic<> v(nv);

    // shortcut for the case of no constraints:
    if (nc == 0) {

        ChSparseMatrix H(nv, nv);
        ChVectorDynamic<> k(nv);


        m_timer_convert.start();

        ChSparsityPatternLearner sparsity_pattern(nv, nv);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0); 
        sparsity_pattern.Apply(H);
        sysd.ConvertToMatrixForm(&H,&k);  
        LS_solver->A() = H; 
        LS_solver->b() = k; 

        m_timer_convert.stop();
        if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

        // v = H\k
        LS_solver->SetupCurrent();
        LS_solver->SolveCurrent();

        //v = LS_solver->x();
        sysd.FromVectorToVariables(LS_solver->x());

        return 0;
    }
        
    ChSparseMatrix Cq(nc,nv);
    ChSparseMatrix E(nc,nc);
    ChVectorDynamic<> k(nv);
    ChVectorDynamic<> b(nc);

    ChSparseMatrix    A(nv+nc,nv+nc);
    ChVectorDynamic<> B(nv+nc);

    ChVectorDynamic<> l(nc);
    ChVectorDynamic<> z(nc);
    ChVectorDynamic<> y(nc);

    ChVectorDynamic<> l_old(nc);
    ChVectorDynamic<> z_old(nc);
    ChVectorDynamic<> y_old(nc);
    ChVectorDynamic<> v_old(nv);
    
    sysd.ConvertToMatrixForm(&Cq, 0, &E, &k, &b, 0);
    Cq.makeCompressed();
    E.makeCompressed();

    if (!this->m_warm_start) {
        l.setZero();
        z.setZero();
        y.setZero();

        //***TODO**? or just accept approximation?
        //v = M\(k + D*l); % PERFORMANCE HIT, only needed if truncating Nesterov before convergence
        v.setZero(); // enough approx? or better sysd.FromVariablesToVector(v, false); ?
    }
    else
    {
        // warmstarted l:
        sysd.FromConstraintsToVector(l, false);

        // warmstarted v:
        //v = H\(k + D*l); // PERFORMANCE HIT, probably better reuse last v if possible..
        sysd.FromVariablesToVector(v, false); // this works supposing that variables have been warmstarted with "v" too, otherwise:  

        // warmstarted y:
        // the following correct only if r_dual was approx.=0. //***TODO*** as parameter
        y = - (Cq*v - E*l + b); //  dual residual exploiting the kkt form instead of - (N*l+r), faster!
            
        /*
        GetLog() << "Y warmastarted:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
        */
        
        // warmstarted z:
        z = l; //  warm start also this - should project? //***TODO*** as parameter
        //sysd.ConstraintsProject(z);

    }

    ChVectorDynamic<> S(nc);

    if (this->precond == true) {
        // Compute diagonal values of N , only mass effect, neglecting stiffness for the moment, TODO
        //  g_i=[Cq_i]*[invM_i]*[Cq_i]' 
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Update_auxiliary();

        // Average all g_i for the triplet of contact constraints n,u,v.
        int j_friction_comp = 0;
        double gi_values[3];
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
                j_friction_comp++;
                if (j_friction_comp == 3) {
                    double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                    mconstraints[ic - 2]->Set_g_i(average_g_i);
                    mconstraints[ic - 1]->Set_g_i(average_g_i);
                    mconstraints[ic - 0]->Set_g_i(average_g_i);
                    j_friction_comp = 0;
                }
            }
        }
        // The vector with the diagonal of the N matrix
        S.setZero();
        int d_i = 0;
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive()) {
                S(d_i, 0) = sqrt(mconstraints[ic]->Get_g_i());  // square root of diagonal of N, just mass matrices considered, no stiffness matrices anyway
                ++d_i;
            }
        // Now we should scale Cq, E, b as
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        
        // but to avoid storing Cq and E and assembly in A, we postpone this by scaling the entire A matrix later via a IS*A*IS operation
        
        // b = diag(S)*b;
        b = b.cwiseProduct(S);

        // warm started values must be scaled too
        l = l.cwiseQuotient(S); // from l to \breve{l}
        z = z.cwiseQuotient(S); 
        y = y.cwiseProduct(S);

    }
    else {
        S.setConstant(1);
    }  

    // vsigma = ones(nconstr,1)*sigma;
    ChVectorDynamic<> vsigma(nc); // not needed
    vsigma.setConstant(this->sigma);
    

    // vrho = ones(nconstr,1)*rho;
    ChVectorDynamic<> vrho(nc);
    vrho.setConstant(rho_i);

    // vrho(fric==-2) = rho_b;          // special step for bilateral joints
    int s_c = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive()) {
            if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                vrho(s_c) = rho_b;
            s_c++;
        }
    }
 
    // FACTORIZATION
    //
    // A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    
    m_timer_convert.start();

    LS_solver->A().resize(nv + nc, nv + nc); // otherwise conservativeResize in ConvertToMatrixForm() causes error

    //sysd.ConvertToMatrixForm(&LS_solver->A(),&LS_solver->b());  // A = [M, Cq'; Cq, E ];
    // much faster to fill brand new sparse matrices??!!
    ChSparsityPatternLearner sparsity_pattern(nv + nc, nv + nc);
    sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
    sparsity_pattern.Apply(A);

    sysd.ConvertToMatrixForm(&A,&B);  // A = [M, Cq'; Cq, E ]; 

    if (this->precond) {
        // the following is equivalent to having scaled 
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        ChVectorDynamic<> IS(nv + nc);
        IS << Eigen::VectorXd::Ones(nv) , S;
        A = IS.asDiagonal() * A * IS.asDiagonal();
        B = IS.asDiagonal() * B; // not needed? B here only factorization...
    }

    LS_solver->A() = A; 
    LS_solver->b() = B; 

    for (int i = 0; i < nc; ++i)
        LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    m_timer_convert.stop();
    if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

    m_timer_factorize.start();
                
    LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

    m_timer_factorize.stop();
    if (this->verbose) GetLog() << " Time for factorize : << " << m_timer_factorize.GetTimeSecondsIntermediate() << "s\n";

    /*
    res_story.r_prim=zeros(1,1);
    res_story.r_dual_Nlry=zeros(1,1);
    res_story.r_dual=zeros(1,1);
    res_story.r_combined_pre=zeros(1,1);
    res_story.r_combined=zeros(1,1);
    res_story.r_deltal=zeros(1,1);
    res_story.r_rho=zeros(1,1);
    res_story.r_violation=zeros(1,1);
    */

    for (int iter = 0; iter < m_max_iterations; iter++) {

        // diagnostic
        l_old = l;
        z_old = z;
        y_old = y;
        v_old = v;

        // Z  u

        // z = project_orthogonal( l + y./vrho,  fric);
        z = l + y.cwiseQuotient(vrho);
        sysd.ConstraintsProject(z); 


        // X   (lambda)

        // SOLVE LINEAR SYSTEM HERE
        // ckkt = -bkkt + (vsigma+vrho).*z - y;
        
        ChVectorDynamic<> ckkt = -b + (vsigma + vrho).cwiseProduct(z) - y;
        LS_solver->b() << k, ckkt;         // B = [k;ckkt];
        
        m_timer_solve.start();

        LS_solver->SolveCurrent();                                                      // LU forward/backsolve ++++++++++++++++++++++++++++++++++++++
        
        m_timer_solve.stop();
        if (this->verbose) GetLog() << " Time for solve : << " << m_timer_solve.GetTimeSecondsIntermediate() << "s\n";

        // x = dA\B;      // A* x = B  with x = [v, -l]    
        l = -LS_solver->x().block(nv, 0, nc, 1);
        v =  LS_solver->x().block(0, 0, nv, 1);
        

        // Y

        y = y + vrho.asDiagonal() * (l - z); 


        // Compute residuals for tolerances
        /*
        r_prim         = norm((z-l).*S, inf);
        r_prim_pre     = norm((z-l)   , inf); 
        r_dual_Nlry    = norm((D'*v-E*l+bkkt+y)./S,inf); % dual residual exploiting the kkt form instead of (N*l+r+y)./S, faster!
        r_dual_Nlry_pre= norm((D'*v-E*l+bkkt+y)   ,inf); % note: does not coincide with r_dual as in plain ADMM, discover why
        r_dual         = norm((vrho.*(l-l_old))./S,inf); % for order is Z-X-Y , different than in plain ADMM X-Z-Y - BUT NOT AFTER NESTEROV CORRECTION!
        r_dual_pre     = norm((vrho.*(l-l_old))   ,inf);
        r_combined     = norm((z-l).*S, 2) +  norm((l-l_old).*S, 2); % combined res. in original metric
        r_combined_pre = norm((z-l)   , 2) +  norm((l-l_old)    ,2); % combined res. in precond.metric
        */
        r_prim = ((z - l).cwiseProduct(S)).lpNorm<Eigen::Infinity>();     //r_prim     = norm((z - l).*S, inf);   
        double r_prim_pre = (z - l).lpNorm<Eigen::Infinity>();              //r_prim_pre = norm((z - l)   , inf); 

        r_dual = (((l - l_old).cwiseProduct(vrho)).cwiseQuotient(S)).lpNorm<Eigen::Infinity>(); // r_dual = norm((vrho.*(l - l_old)). / S, inf); % even faster!See book of Boyd.But coincides only for alpha = 1 !!!
        double r_dual_pre = ((l - l_old).cwiseProduct(vrho)).lpNorm<Eigen::Infinity>();  // r_dual_pre     = norm((vrho.*(l - l_old))   ,inf); 

        //r_combined = norm((z - l).*S, 2) + norm((l - l_old). / S, 2);% combined res.in original metric
        //r_combined_pre = norm((z - l), 2) + norm((l - l_old), 2);% combined res.in precond.metric



        if (this->verbose)
            GetLog() << "ADMMfast iter=" << iter << " prim=" << r_prim << " dual=" << r_dual << "  rho=" << rho_i << " alpha=" << nalpha << "  tols=" << this->tol_prim << " " << this->tol_dual <<  "\n";

        // For recording into violation history, if debugging
        if (this->record_violation_history) {
            // combined residual 
            //double r_combined = ((z - l).cwiseProduct(S)).norm() + ((l - l_old).cwiseQuotient(S)).norm();
            //double r_combined_pre = (z - l).norm() + (l - l_old).norm(); //combined res.in precond.metric
            double c_k_p = (1 / rho) * (y - y_old).norm() + rho * (l - l_old).norm();
            AtIterationEnd(c_k_p, (l - l_old).norm(), iter);
        }
        
        // Termination:
        if ((r_prim < this->tol_prim) && (r_dual < this->tol_dual)) {
            if (this->verbose)
                GetLog() << "ADMMfast converged ok! at iter=" << iter << "\n";
            break;
        }

        // Nesterov acceleration
        if (iter > 1) {
            double c_k_p = (1 / rho) * (y - y_old).norm() + rho * (l - l_old).norm();
            if (c_k_p < eta * c_k) {
                double nalpha_p = (1.0 + sqrt(1.0 + 4 * pow(nalpha,2))) / (2.0);
                l = l + ((nalpha - 1.0) / (nalpha_p)) * (l - l_old);
                v = v + ((nalpha - 1.0) / (nalpha_p)) * (v - v_old); // trick to avoid recomputing it at the end
                y = y + ((nalpha - 1.0) / (nalpha_p)) * (y - y_old);
                nalpha = nalpha_p;
                c_k = c_k_p;
            }
            else{
                if (this->verbose) GetLog() << "ADMMfast Nesterov restart." << iter << "\n";
                nalpha = 1.0;
                c_k = (1 / eta) * c_k_p;
            }
        }


        // once in a while update the rho step parameter
        if ((iter % this->stepadjust_each) == 0) {

            double rhofactor = 1; // default do not shrink / enlarge

            if (this->stepadjust_type == AdmmStepType::NONE) {
                rhofactor = 1.;
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_UNSCALED) {
                rhofactor = sqrt(r_prim_pre / r_dual_pre);
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_FAST) {
                double r_prim_scaled = r_prim_pre / (ChMax(z.lpNorm<Eigen::Infinity>(), l.lpNorm<Eigen::Infinity>()) + 1e-10); // maybe norm(l, inf) very similar to norm(z, inf)
                double r_dual_scaled = r_dual_pre / (y.lpNorm<Eigen::Infinity>() + 1e-10);  //  as in "ADMM Penalty Parameter Selection by Residual Balancing", Brendt Wohlberg
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_RANGE) {
                double r_prim_scaled = r_prim / this->tol_prim;
                double r_dual_scaled = r_dual / this->tol_dual;
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }


            // safeguards against extreme shrinking
            if (rhofactor < 1.0 / this->stepadjust_maxfactor) {
                rhofactor = 1.0 / this->stepadjust_maxfactor;
            }
            if (rhofactor > this->stepadjust_maxfactor) {
                rhofactor = this->stepadjust_maxfactor;
            }

            if ((rhofactor > this->stepadjust_threshold) || (rhofactor < 1.0 / this->stepadjust_threshold)) {

                ChTimer<> m_timer_refactorize;
                m_timer_refactorize.start();

                // Avoid rebuilding all sparse matrix: 
                // A) just remove old rho with -= :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) -= -(sigma + vrho(i));  

                // Update rho
                rho_i = rho_i * rhofactor;

                // vrho(fric == -2) = rho_b; //  special step for bilateral joints
                vrho.setConstant(rho_i);
                s_c = 0;
                for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
                    if (mconstraints[ic]->IsActive()) {
                        if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                            vrho(s_c) = rho_b;
                        s_c++;
                    }
                }

                // UPDATE FACTORIZATION
                //
                //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];
                //
                // To avoid rebuilding A, we just removed the rho step from the diagonal in A), and now: 
                // B) add old rho with += :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  

                LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

                m_timer_refactorize.stop();
                if (this->verbose) GetLog() << " Time for re-factorize : << " << m_timer_refactorize.GetTimeSecondsIntermediate() << "s\n";
            }

        } // end step adjust


    } // end iteration

    l = l.cwiseProduct(S);

    /*
    GetLog() << "Y resulting:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
    */

    sysd.FromVectorToConstraints(l);
    sysd.FromVectorToVariables(v);

    return r_dual;
}